

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

DrawResult * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::BaseTestInstance::draw
          (DrawResult *__return_storage_ptr__,BaseTestInstance *this,deUint32 vertexCount,
          vector<float,_std::allocator<float>_> *patchTessLevels,Winding winding,bool usePointMode)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var1;
  Allocation *pAVar2;
  int *memory;
  pointer pPVar3;
  pointer pPVar4;
  TestLog *pTVar5;
  int iVar6;
  int iVar7;
  DeviceInterface *vk;
  VkDevice device;
  GraphicsPipelineBuilder *pGVar8;
  const_iterator cVar9;
  ostream *poVar10;
  _func_bool_PerPrimitive_ptr_PerPrimitive_ptr *pred;
  long lVar11;
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *unsorted;
  char *pcVar12;
  int iVar13;
  int numIndentationSpaces;
  key_type local_3d0;
  long *local_3b0;
  long local_3a8;
  long local_3a0 [2];
  string local_390;
  key_type local_370;
  VkQueue local_350;
  Move<vk::Handle<(vk::HandleType)18>_> local_348;
  VkPipeline local_328;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_320;
  key_type local_300;
  string local_2e0;
  undefined1 local_2c0 [252];
  deUint32 local_1c4;
  bool local_1c0;
  VkPrimitiveTopology local_1bc;
  VkDeviceSize vertexBufferOffset;
  pointer pPStack_1b0;
  pointer local_1a8;
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_350 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  memset((GraphicsPipelineBuilder *)local_2c0,0,0xfc);
  local_1c0 = false;
  local_1bc = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_1c4 = 6;
  pGVar8 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                     ((GraphicsPipelineBuilder *)local_2c0,this->m_vertexFormat,this->m_vertexStride
                     );
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"vert","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_3d0);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                      *(ProgramBinary **)(cVar9._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"tesc","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_370);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                      *(ProgramBinary **)(cVar9._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"tese","");
  getProgramName(&local_2e0,&local_390,winding,usePointMode);
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_2e0);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                      *(ProgramBinary **)(cVar9._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_3b0 = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"geom","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vertexBufferOffset);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vertexBufferOffset,(char *)local_3b0,local_3a8);
  pcVar12 = "";
  if (usePointMode) {
    pcVar12 = "_point_mode";
  }
  lVar11 = 0xb;
  if (!usePointMode) {
    lVar11 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,lVar11);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertexBufferOffset);
  std::ios_base::~ios_base(local_148);
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_300);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
                      *(ProgramBinary **)(cVar9._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            (&local_348,pGVar8,vk,device,
             (VkPipelineLayout)
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal);
  DStack_320.m_device =
       local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  DStack_320.m_allocator =
       local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_328.m_internal =
       local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  DStack_320.m_deviceIface =
       local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if (local_3b0 != local_3a0) {
    operator_delete(local_3b0,local_3a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_2c0);
  pAVar2 = (this->m_resultBuffer).m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset(pAVar2->m_hostPtr,0,this->m_resultBufferSizeBytes);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
             this->m_resultBufferSizeBytes);
  beginCommandBuffer(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  beginRenderPassWithRasterizationDisabled
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkFramebuffer)
             (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             local_328.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,0,1,&this->m_descriptorSet,0,0);
  vertexBufferOffset = 0;
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)vertexCount,1,0,0);
  endRenderPass(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&vertexBufferOffset,0x40,0x2000,
             (VkBuffer)
             (this->m_resultBuffer).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
             object.m_internal,0,this->m_resultBufferSizeBytes);
  numIndentationSpaces = 0;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x8000,
             0x4000,0,0,0,1,(VkBufferMemoryBarrier *)&vertexBufferOffset,0,0);
  endCommandBuffer(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  submitCommandsAndWait
            (vk,device,local_350,
             (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pAVar2 = (this->m_resultBuffer).m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
             this->m_resultBufferSizeBytes);
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->success = true;
  iVar13 = this->m_numPatchesToDraw;
  iVar6 = multiplePatchReferencePrimitiveCount
                    ((this->m_caseDef).primitiveType,(this->m_caseDef).spacingMode,usePointMode,
                     (patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start,iVar13);
  __return_storage_ptr__->refNumPrimitives = iVar6;
  iVar7 = numVerticesPerPrimitive((this->m_caseDef).primitiveType,usePointMode);
  __return_storage_ptr__->numPrimitiveVertices = iVar7;
  memory = (int *)pAVar2->m_hostPtr;
  iVar7 = *memory;
  __return_storage_ptr__->numPrimitives = iVar7;
  pred = (_func_bool_PerPrimitive_ptr_PerPrimitive_ptr *)
         (ulong)(uint)this->m_resultBufferPrimitiveDataOffset;
  readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
            ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              *)local_2c0,iVar7,memory,this->m_resultBufferPrimitiveDataOffset,iVar13);
  sorted<vkt::tessellation::(anonymous_namespace)::PerPrimitive,bool(*)(vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&,vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&)>
            ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              *)&vertexBufferOffset,(tessellation *)local_2c0,unsorted,pred);
  pPVar3 = (__return_storage_ptr__->primitives).
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (__return_storage_ptr__->primitives).
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)vertexBufferOffset;
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPStack_1b0;
  (__return_storage_ptr__->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1a8;
  vertexBufferOffset = 0;
  pPStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  if (pPVar3 != (pointer)0x0) {
    operator_delete(pPVar3,(long)pPVar4 - (long)pPVar3);
  }
  if (vertexBufferOffset != 0) {
    operator_delete((void *)vertexBufferOffset,(long)local_1a8 - vertexBufferOffset);
  }
  if ((int  [2])local_2c0._0_8_ != (int  [2])0x0) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ - local_2c0._0_8_);
  }
  if (iVar7 != iVar6) {
    pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    iVar13 = this->m_numPatchesToDraw;
    vertexBufferOffset = (VkDeviceSize)pTVar5;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pPStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pPStack_1b0,"Failure: the number of generated primitives is ",0x2f);
    std::ostream::operator<<((ostringstream *)&pPStack_1b0,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pPStack_1b0,", expected at least ",0x14);
    std::ostream::operator<<((ostringstream *)&pPStack_1b0,iVar6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pPStack_1b0);
    std::ios_base::~ios_base(local_140);
    if (iVar13 == 1) {
      vertexBufferOffset = (VkDeviceSize)pTVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pPStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pPStack_1b0,
                 "Note: rendered one patch; tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                 ,0x6f);
      local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           (deUint64)
           (patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_3d0._M_dataplus._M_p =
           (pointer)(patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
      elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                ((string *)local_2c0,(tessellation *)&local_348,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 &local_3d0,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 0x6,0,numIndentationSpaces);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pPStack_1b0,(char *)local_2c0._0_8_,local_2c0._8_8_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      if (local_2c0._0_8_ != (long)local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
      }
    }
    else {
      vertexBufferOffset = (VkDeviceSize)pTVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pPStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pPStack_1b0,"Note: rendered ",0xf);
      std::ostream::operator<<((ostringstream *)&pPStack_1b0,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pPStack_1b0," patches in one draw call; ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pPStack_1b0,
                 "tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                 ,100);
      local_348.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           (deUint64)
           (patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_3d0._M_dataplus._M_p =
           (pointer)(patchTessLevels->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
      elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                ((string *)local_2c0,(tessellation *)&local_348,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 &local_3d0,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 0x6,0,numIndentationSpaces);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pPStack_1b0,(char *)local_2c0._0_8_,local_2c0._8_8_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      if (local_2c0._0_8_ != (long)local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pPStack_1b0);
    std::ios_base::~ios_base(local_140);
    __return_storage_ptr__->success = false;
  }
  if (local_328.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_320,local_328);
  }
  return __return_storage_ptr__;
}

Assistant:

BaseTestInstance::DrawResult BaseTestInstance::draw (const deUint32 vertexCount, const std::vector<float>& patchTessLevels, const Winding winding, const bool usePointMode)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();
	const VkQueue			queue	= m_context.getUniversalQueue();

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setPatchControlPoints        (NUM_TESS_LEVELS)
		.setVertexInputSingleAttribute(m_vertexFormat, m_vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(getProgramName("tese", winding, usePointMode)), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,                m_context.getBinaryCollection().get(getProgramName("geom", usePointMode)), DE_NULL)
		.build                        (vk, device, *m_pipelineLayout, *m_renderPass));

	{
		const Allocation& alloc = m_resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(m_resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_resultBufferSizeBytes);
	}

	beginCommandBuffer(vk, *m_cmdBuffer);
	beginRenderPassWithRasterizationDisabled(vk, *m_cmdBuffer, *m_renderPass, *m_framebuffer);

	vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*m_cmdBuffer, vertexCount, 1u, 0u, 0u);
	endRenderPass(vk, *m_cmdBuffer);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *m_resultBuffer, 0ull, m_resultBufferSizeBytes);

		vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *m_cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);

	// Read back and check results

	const Allocation& resultAlloc = m_resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_resultBufferSizeBytes);

	DrawResult result;
	result.success				= true;
	result.refNumPrimitives     = multiplePatchReferencePrimitiveCount(m_caseDef.primitiveType, m_caseDef.spacingMode, usePointMode, &patchTessLevels[0], m_numPatchesToDraw);
	result.numPrimitiveVertices = numVerticesPerPrimitive(m_caseDef.primitiveType, usePointMode);
	result.numPrimitives        = *static_cast<deInt32*>(resultAlloc.getHostPtr());
	result.primitives           = sorted(readInterleavedData<PerPrimitive>(result.numPrimitives, resultAlloc.getHostPtr(), m_resultBufferPrimitiveDataOffset, sizeof(PerPrimitive)),
										 byPatchPrimitiveID);

	// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
	DE_ASSERT(result.numPrimitives <= m_maxNumPrimitivesInDrawCall);

	tcu::TestLog& log = m_context.getTestContext().getLog();
	if (result.numPrimitives != result.refNumPrimitives)
	{
		logPrimitiveCountError(log, m_numPatchesToDraw, result.numPrimitives, result.refNumPrimitives, patchTessLevels);
		result.success = false;
	}
	return result;
}